

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O3

nsync_time nsync_note_notified_deadline_(nsync_note n)

{
  int iVar1;
  nsync_time *pnVar2;
  __syscall_slong_t *p_Var3;
  __time_t _Var4;
  __syscall_slong_t _Var5;
  nsync_time nVar6;
  nsync_time nVar7;
  nsync_time a;
  
  if (n->notified == 0) {
    nsync_mu_lock(&n->note_mu);
    if (n->notified == 0) {
      if (n->expiry_time_valid == 0) {
        pnVar2 = &nsync_time_no_deadline;
        p_Var3 = &nsync_time_no_deadline.tv_nsec;
      }
      else {
        pnVar2 = &n->expiry_time;
        p_Var3 = &(n->expiry_time).tv_nsec;
      }
    }
    else {
      p_Var3 = &nsync_time_zero.tv_nsec;
      pnVar2 = &nsync_time_zero;
    }
    _Var5 = *p_Var3;
    _Var4 = pnVar2->tv_sec;
    nsync_mu_unlock(&n->note_mu);
    nVar7.tv_nsec = _Var5;
    nVar7.tv_sec = _Var4;
    iVar1 = nsync_time_cmp(nVar7,(nsync_time)ZEXT816((ulong)0));
    if (0 < iVar1) {
      nVar7 = nsync_time_now();
      a.tv_nsec = _Var5;
      a.tv_sec = _Var4;
      iVar1 = nsync_time_cmp(a,nVar7);
      if (iVar1 < 1) {
        notify(n);
        _Var4 = 0;
        _Var5 = 0;
      }
    }
  }
  else {
    _Var4 = 0;
    _Var5 = 0;
  }
  nVar6.tv_nsec = _Var5;
  nVar6.tv_sec = _Var4;
  return nVar6;
}

Assistant:

nsync_time nsync_note_notified_deadline_ (nsync_note n) {
	nsync_time ntime;
	if (ATM_LOAD_ACQ (&n->notified) != 0) {
		ntime = nsync_time_zero;
	} else {
		nsync_mu_lock (&n->note_mu);
		ntime = NOTIFIED_TIME (n);
		nsync_mu_unlock (&n->note_mu);
		if (nsync_time_cmp (ntime, nsync_time_zero) > 0) {
			if (nsync_time_cmp (ntime, nsync_time_now ()) <= 0) {
				notify (n);
				ntime = nsync_time_zero;
			}
		}
	}
	return (ntime);
}